

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O1

uint16_t modifier_mask_from_keysym
                   (xcb_key_symbols_t *symbols,xcb_keycode_t *modifiers,uint8_t modifier_count,
                   uint8_t keycodes_per_modifier,xcb_keysym_t keysym)

{
  xcb_keycode_t *__ptr;
  ulong uVar1;
  xcb_keycode_t *pxVar2;
  int iVar3;
  uint uVar4;
  xcb_keycode_t *pxVar5;
  xcb_keycode_t xVar6;
  xcb_keycode_t *pxVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  __ptr = (xcb_keycode_t *)xcb_key_symbols_get_keycode(symbols);
  if (__ptr != (xcb_keycode_t *)0x0) {
    bVar10 = modifier_count != '\0';
    pxVar2 = __ptr;
    if (bVar10) {
      uVar1 = (ulong)keycodes_per_modifier;
      uVar4 = 0;
      pxVar7 = (xcb_keycode_t *)0x0;
      pxVar2 = (xcb_keycode_t *)(ulong)modifier_count;
      do {
        bVar9 = keycodes_per_modifier != '\0';
        if (keycodes_per_modifier != '\0') {
          uVar8 = 0;
          do {
            if (modifiers[uVar8 + (long)pxVar7 * uVar1] == '\0') {
              iVar3 = 7;
            }
            else {
              iVar3 = 0;
              xVar6 = *__ptr;
              pxVar5 = __ptr;
              while (pxVar5 = pxVar5 + 1, xVar6 != '\0') {
                if (xVar6 == modifiers[uVar8 + (long)pxVar7 * uVar1]) {
                  free(__ptr);
                  iVar3 = 1;
                  pxVar2 = (xcb_keycode_t *)(ulong)(uint)(1 << ((uint)pxVar7 & 0x1f));
                  break;
                }
                xVar6 = *pxVar5;
              }
            }
            if ((iVar3 != 7) && (iVar3 != 0)) break;
            uVar8 = uVar8 + 1;
            bVar9 = uVar8 < uVar1;
          } while (uVar8 != uVar1);
        }
        if (bVar9) break;
        uVar4 = uVar4 + 1;
        bVar10 = uVar4 < modifier_count;
        pxVar7 = pxVar7 + 1;
      } while (pxVar7 != (xcb_keycode_t *)(ulong)modifier_count);
    }
    if (bVar10) {
      return (uint16_t)pxVar2;
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

static uint16_t modifier_mask_from_keysym(xcb_key_symbols_t *symbols,
                                          const xcb_keycode_t *modifiers, uint8_t modifier_count,
                                          uint8_t keycodes_per_modifier, xcb_keysym_t keysym)
{
        xcb_keycode_t *keycodes = xcb_key_symbols_get_keycode(symbols, keysym);

        if (keycodes == NULL) {
                return 0;
        }

        for (uint8_t i = 0; i < modifier_count; ++i) {
                for (uint8_t j = 0; j < keycodes_per_modifier; ++j) {
                        xcb_keycode_t modifier = modifiers[i * keycodes_per_modifier + j];

                        if (modifier == XCB_NONE) {
                                continue;
                        }

                        for (xcb_keycode_t *key = keycodes; *key != XCB_NONE; key++) {
                                if (*key == modifier) {
                                        free(keycodes);

                                        return (uint16_t)(1 << i);
                                }
                        }
                }
        }

        free(keycodes);

        return 0;
}